

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

void obj_from_obj(OBJ_DATA *obj)

{
  short *psVar1;
  CHAR_DATA *pCVar2;
  OBJ_DATA *pOVar3;
  int iVar4;
  OBJ_DATA **ppOVar5;
  OBJ_DATA *pOVar6;
  OBJ_DATA *pOVar7;
  string_view fmt;
  string_view fmt_00;
  
  pOVar7 = obj->in_obj;
  if (pOVar7 == (OBJ_DATA *)0x0) {
    fmt._M_str = "Obj_from_obj: null obj_from.";
    fmt._M_len = 0x1c;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  pOVar3 = pOVar7->contains;
  if (pOVar7->contains == obj) {
    ppOVar5 = &pOVar7->contains;
  }
  else {
    do {
      pOVar6 = pOVar3;
      if (pOVar6 == (OBJ_DATA *)0x0) {
        fmt_00._M_str = "Obj_from_obj: obj not found.";
        fmt_00._M_len = 0x1c;
        CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_00);
        return;
      }
      pOVar3 = pOVar6->next_content;
    } while (pOVar6->next_content != obj);
    ppOVar5 = &pOVar6->next_content;
  }
  *ppOVar5 = obj->next_content;
  obj->next_content = (OBJ_DATA *)0x0;
  obj->in_obj = (OBJ_DATA *)0x0;
  do {
    pCVar2 = pOVar7->carried_by;
    if (pCVar2 != (CHAR_DATA *)0x0) {
      iVar4 = get_obj_weight(obj);
      psVar1 = &pCVar2->carry_weight;
      *psVar1 = *psVar1 - (short)iVar4;
    }
    pOVar7 = pOVar7->in_obj;
  } while (pOVar7 != (OBJ_DATA *)0x0);
  return;
}

Assistant:

void obj_from_obj(OBJ_DATA *obj)
{
	OBJ_DATA *obj_from;

	if ((obj_from = obj->in_obj) == nullptr)
	{
		RS.Logger.Debug("Obj_from_obj: null obj_from.");
		return;
	}

	if (obj == obj_from->contains)
	{
		obj_from->contains = obj->next_content;
	}
	else
	{
		OBJ_DATA *prev;

		for (prev = obj_from->contains; prev; prev = prev->next_content)
		{
			if (prev->next_content == obj)
			{
				prev->next_content = obj->next_content;
				break;
			}
		}

		if (prev == nullptr)
		{
			RS.Logger.Warn("Obj_from_obj: obj not found.");
			return;
		}
	}

	obj->next_content = nullptr;
	obj->in_obj = nullptr;

	for (; obj_from != nullptr; obj_from = obj_from->in_obj)
	{
		if (obj_from->carried_by != nullptr)
		{
			obj_from->carried_by->carry_weight -= get_obj_weight(obj);
		}
	}
}